

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

int ON_UuidCompare(ON_UUID *a,ON_UUID *b)

{
  ON_UUID *b_local;
  ON_UUID *a_local;
  
  if (a == (ON_UUID *)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_UUID *)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_UUID *)0x0) {
    a_local._4_4_ = 1;
  }
  else if (a->Data1 < b->Data1) {
    a_local._4_4_ = -1;
  }
  else if (b->Data1 < a->Data1) {
    a_local._4_4_ = 1;
  }
  else if (a->Data2 < b->Data2) {
    a_local._4_4_ = -1;
  }
  else if (b->Data2 < a->Data2) {
    a_local._4_4_ = 1;
  }
  else if (a->Data3 < b->Data3) {
    a_local._4_4_ = -1;
  }
  else if (b->Data3 < a->Data3) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = memcmp(a->Data4,b->Data4,8);
  }
  return a_local._4_4_;
}

Assistant:

int ON_UuidCompare( const ON_UUID* a, const ON_UUID* b )
{
  // NOTE WELL: This code has to work the same way
  //            on Windows and non-Windows OSs and on
  //            both big and little endian CPUs
  //            taking into account the way ON_UUIDs
  //            are read/written by ON_BinaryArchive.
  //
  //            On Windows, ::UuidCompare() must agree 
  //            with this function.

  if ( !a ) 
  {
    return b ? -1 : 0;
  }
  if ( !b )
    return 1;

  if ( a->Data1 < b->Data1 ) return -1;
  if ( a->Data1 > b->Data1 ) return  1;

  if ( a->Data2 < b->Data2 ) return -1;
  if ( a->Data2 > b->Data2 ) return  1;

  if ( a->Data3 < b->Data3 ) return -1;
  if ( a->Data3 > b->Data3 ) return  1;
  return memcmp(a->Data4,b->Data4,sizeof(a->Data4));
}